

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemRecordMap.cpp
# Opt level: O0

MemRecordMap * MemRecordMap::getInstance(void)

{
  MemRecordMap *this;
  lock_guard<std::mutex> local_10;
  lock_guard<std::mutex> guard;
  
  if (pInstance == (MemRecordMap *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_10,&m_memMutex);
    if (pInstance == (MemRecordMap *)0x0) {
      this = (MemRecordMap *)operator_new(0x30);
      memset(this,0,0x30);
      MemRecordMap(this);
      pInstance = this;
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_10);
  }
  return pInstance;
}

Assistant:

MemRecordMap* MemRecordMap::getInstance() {//DCL(double check lock)
    if(pInstance == nullptr){//first check
        lock_guard<mutex> guard(m_memMutex);//RAII
        if(pInstance == nullptr)//second check
            pInstance = new MemRecordMap();//c++11 will ensure this new operator atomic
    }
    return pInstance;
}